

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O0

int32_t u_digit_63(UChar32 ch,int8_t radix)

{
  char cVar1;
  int32_t iVar2;
  char local_e;
  int8_t value;
  int8_t radix_local;
  UChar32 ch_local;
  
  if ((byte)(radix - 2U) < 0x23) {
    iVar2 = u_charDigitValue_63(ch);
    local_e = (char)iVar2;
    if (local_e < '\0') {
      cVar1 = (char)ch;
      if ((ch < 0x61) || (0x7a < ch)) {
        if ((ch < 0x41) || (0x5a < ch)) {
          if ((ch < 0xff41) || (0xff5a < ch)) {
            if ((0xff20 < ch) && (ch < 0xff3b)) {
              local_e = cVar1 + -0x17;
            }
          }
          else {
            local_e = cVar1 + -0x37;
          }
        }
        else {
          local_e = cVar1 + -0x37;
        }
      }
      else {
        local_e = cVar1 + -0x57;
      }
    }
  }
  else {
    local_e = -1;
  }
  if (radix <= local_e) {
    local_e = -1;
  }
  return (int)local_e;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_digit(UChar32 ch, int8_t radix) {
    int8_t value;
    if((uint8_t)(radix-2)<=(36-2)) {
        value=(int8_t)u_charDigitValue(ch);
        if(value<0) {
            /* ch is not a decimal digit, try latin letters */
            if(ch>=0x61 && ch<=0x7A) {
                value=(int8_t)(ch-0x57);  /* ch - 'a' + 10 */
            } else if(ch>=0x41 && ch<=0x5A) {
                value=(int8_t)(ch-0x37);  /* ch - 'A' + 10 */
            } else if(ch>=0xFF41 && ch<=0xFF5A) {
                value=(int8_t)(ch-0xFF37);  /* fullwidth ASCII a-z */
            } else if(ch>=0xFF21 && ch<=0xFF3A) {
                value=(int8_t)(ch-0xFF17);  /* fullwidth ASCII A-Z */
            }
        }
    } else {
        value=-1;   /* invalid radix */
    }
    return (int8_t)((value<radix) ? value : -1);
}